

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_Dsd6DecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  word wVar6;
  word wVar7;
  word wVar8;
  word wVar9;
  abctime aVar10;
  uint jVar;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  word tCof0;
  word tCof1;
  Dau_Dsd_t P1;
  int in_stack_fffffffffffff258;
  ulong local_da0;
  word local_d48;
  long local_d40;
  ulong local_d38;
  word local_d30;
  Dau_Dsd_t local_d28;
  
  aVar5 = Abc_Clock();
  do {
    uVar1 = 0;
    if (0 < nVars) {
      uVar1 = nVars;
    }
    jVar = nVars - 1;
    local_d40 = (long)(int)(nVars - 2U);
    local_da0 = (ulong)(uint)nVars;
    uVar11 = jVar;
    while (0 < (int)local_da0) {
      local_d38 = local_da0;
      local_da0 = local_da0 - 1;
      iVar4 = (int)local_da0;
      wVar6 = Abc_Tt6Cofactor0(*pTruth,iVar4);
      wVar7 = Abc_Tt6Cofactor1(*pTruth,iVar4);
      bVar14 = 0;
      uVar13 = 0;
      for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
        if (uVar11 != uVar16) {
          iVar2 = Dau_Dsd6FindSupportOne(p,wVar6,wVar7,pVars,iVar4,uVar16,in_stack_fffffffffffff258)
          ;
          uVar13 = uVar13 | iVar2 << (bVar14 & 0x1f);
        }
        bVar14 = bVar14 + 2;
      }
      if ((uVar13 & 0x55555555 & uVar13 >> 1) == 0) {
        local_d28.fSplitPrime = 0;
        local_d28.fWriteTruth = p->fWriteTruth;
        iVar2 = pVars[local_da0 & 0xffffffff];
        pVars[local_da0 & 0xffffffff] = pVars[(int)jVar];
        pVars[(int)jVar] = iVar2;
        Abc_TtSwapVars(pTruth,nVars,iVar4,jVar);
        local_d48 = Abc_Tt6Cofactor0(*pTruth,jVar);
        local_d30 = Abc_Tt6Cofactor1(*pTruth,jVar);
        Dau_DsdWriteString(p,"<");
        Dau_DsdWriteVar(p,pVars[(int)jVar],0);
        Dau_DsdDecomposeInt(&local_d28,&local_d30,jVar);
        Dau_DsdTranslate(p,pVars,jVar,local_d28.pOutput);
        p->nSizeNonDec = local_d28.nSizeNonDec;
        if (local_d28.nSizeNonDec != 0) {
          *pTruth = local_d30;
        }
        Dau_DsdDecomposeInt(&local_d28,&local_d48,jVar);
        Dau_DsdTranslate(p,pVars,jVar,local_d28.pOutput);
        Dau_DsdWriteString(p,">");
        iVar4 = p->nSizeNonDec;
        if (p->nSizeNonDec <= local_d28.nSizeNonDec) {
          iVar4 = local_d28.nSizeNonDec;
        }
        p->nSizeNonDec = iVar4;
        if (local_d28.nSizeNonDec != 0) {
          *pTruth = local_d48;
        }
        return 0;
      }
      uVar16 = uVar13 & 0x55555555 & ~uVar13 >> 1;
      if ((uVar16 - 1 < (uVar16 ^ uVar16 - 1)) &&
         (uVar13 = ~uVar13 & uVar13 >> 1 & 0x55555555, uVar13 - 1 < (uVar13 ^ uVar13 - 1))) {
        iVar2 = Abc_TtSuppFindFirst(uVar16);
        iVar2 = iVar2 >> 1;
        iVar3 = Abc_TtSuppFindFirst(uVar13);
        iVar3 = iVar3 >> 1;
        wVar6 = Abc_Tt6Cofactor0(*pTruth,iVar4);
        wVar7 = Abc_Tt6Cofactor1(*pTruth,iVar4);
        wVar8 = Abc_Tt6Cofactor0(wVar6,iVar2);
        wVar6 = Abc_Tt6Cofactor1(wVar6,iVar2);
        wVar9 = Abc_Tt6Cofactor0(wVar7,iVar3);
        wVar7 = Abc_Tt6Cofactor1(wVar7,iVar3);
        if ((wVar6 == wVar7 && wVar8 == wVar9) || (wVar6 == wVar9 && wVar8 == wVar7)) {
          iVar4 = pVars[iVar2];
          uVar15 = local_da0 & 0xffffffff;
          *pTruth = (wVar7 ^ wVar9) & s_Truths6[uVar15] ^ wVar9;
          pcVar12 = "";
          if (wVar6 == wVar9 && wVar8 == wVar7) {
            pcVar12 = "!";
          }
          sprintf((char *)&local_d28,"<%c%c%s%c>",(ulong)(pVars[uVar15] + 0x61),
                  (ulong)(pVars[iVar3] + 0x61),pcVar12,(ulong)(iVar4 + 0x61));
          iVar2 = Dau_DsdAddVarDef(p,(char *)&local_d28);
          pVars[uVar15] = iVar2;
          iVar2 = pVars[iVar3];
          pVars[iVar3] = pVars[(int)jVar];
          pVars[(int)jVar] = iVar2;
          Abc_TtSwapVars(pTruth,nVars,iVar3,jVar);
          iVar2 = Dau_DsdFindVarDef(pVars,jVar,iVar4);
          iVar4 = pVars[iVar2];
          pVars[iVar2] = pVars[local_d40];
          pVars[local_d40] = iVar4;
          iVar3 = (int)local_d40;
          Abc_TtSwapVars(pTruth,jVar,iVar2,iVar3);
          iVar4 = Dau_DsdFindVarDef(pVars,iVar3,p->nVarsUsed + -1);
          iVar4 = Dau_Dsd6DecomposeSingleVarOne(p,pTruth,pVars,iVar3,iVar4);
          uVar13 = nVars - 2U;
          if ((iVar4 == 0) ||
             (uVar13 = Dau_Dsd6DecomposeSingleVar(p,pTruth,pVars,nVars - 3), uVar13 != nVars)) {
            if ((uVar13 == 0) ||
               (nVars = Dau_Dsd6DecomposeDoubleVars(p,pTruth,pVars,uVar13), local_da0 = local_d38,
               nVars == 0)) {
              aVar10 = Abc_Clock();
              s_Times_2 = s_Times_2 + (aVar10 - aVar5);
              return 0;
            }
            break;
          }
        }
      }
      uVar11 = uVar11 - 1;
    }
    if (local_da0 == 0) {
      aVar10 = Abc_Clock();
      s_Times_2 = s_Times_2 + (aVar10 - aVar5);
      return nVars;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_Dsd6FindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_Dsd6DecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_Dsd6DecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_Dsd6DecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}